

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asm_aux.cpp
# Opt level: O0

void skiwi::allocate_buffer_as_string(asmcode *code)

{
  skiwi *psVar1;
  uint64_t lab;
  uint64_t lab_00;
  operand local_194 [2];
  operation local_18c;
  operand local_188;
  operation local_184 [4];
  operand local_174 [2];
  operation local_16c;
  operand local_168;
  operation local_164 [2];
  operand local_15c [2];
  operation local_154 [2];
  operand local_14c [2];
  operation local_144;
  operand local_140 [2];
  operation local_138;
  operand local_134 [2];
  operation local_12c [3];
  operand local_120 [2];
  operation local_118 [4];
  undefined1 local_108 [8];
  string done;
  string fill;
  operand local_c0;
  operand local_bc;
  operation local_b8;
  int local_b4;
  operand local_b0;
  operand local_ac;
  operation local_a8;
  operand local_a4;
  operand local_a0;
  operation local_9c;
  operand local_98;
  operand local_94;
  operation local_90;
  operand local_8c;
  operand local_88;
  operation local_84;
  unsigned_long local_80;
  operand local_74 [2];
  operation local_6c;
  operand local_68 [2];
  operation local_60;
  operand local_5c;
  operation local_58 [2];
  operand local_50 [2];
  operation local_48 [2];
  operand local_40 [2];
  operation local_38;
  operand local_34 [2];
  operation local_2c [2];
  operand local_24 [2];
  operation local_1c;
  operand local_18;
  operation local_14;
  asmcode *local_10;
  asmcode *code_local;
  
  local_14 = PUSH;
  local_18 = RCX;
  local_10 = code;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_14,&local_18);
  local_1c = MOV;
  local_24[1] = 0x14;
  local_24[0] = MEM_R10;
  local_2c[1] = 0xc0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (local_10,&local_1c,local_24 + 1,local_24,(int *)(local_2c + 1));
  local_2c[0] = ADD;
  local_34[1] = 0x14;
  local_34[0] = RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (local_10,local_2c,local_34 + 1,local_34);
  local_38 = MOV;
  local_40[1] = 0x24;
  local_40[0] = NUMBER;
  local_48[1] = 0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (local_10,&local_38,local_40 + 1,local_40,(int *)(local_48 + 1));
  local_48[0] = SHR;
  local_50[1] = 9;
  local_50[0] = NUMBER;
  local_58[1] = 3;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (local_10,local_48,local_50 + 1,local_50,(int *)(local_58 + 1));
  local_58[0] = INC;
  local_5c = RAX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (local_10,local_58,&local_5c);
  local_60 = MOV;
  local_68[1] = 0xb;
  local_68[0] = RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (local_10,&local_60,local_68 + 1,local_68);
  local_6c = MOV;
  local_74[1] = 0x18;
  local_74[0] = NUMBER;
  local_80 = 0x200000000000000;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (local_10,&local_6c,local_74 + 1,local_74,&local_80);
  local_84 = OR;
  local_88 = RAX;
  local_8c = R15;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (local_10,&stack0xffffffffffffff7c,&stack0xffffffffffffff78,&stack0xffffffffffffff74);
  local_90 = MOV;
  local_94 = MEM_RBP;
  local_98 = RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (local_10,&stack0xffffffffffffff70,&stack0xffffffffffffff6c,&stack0xffffffffffffff68);
  local_9c = MOV;
  local_a0 = R15;
  local_a4 = RBP;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (local_10,&stack0xffffffffffffff64,&stack0xffffffffffffff60,&stack0xffffffffffffff5c);
  local_a8 = OR;
  local_ac = R15;
  local_b0 = NUMBER;
  local_b4 = 5;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (local_10,&stack0xffffffffffffff58,&stack0xffffffffffffff54,&stack0xffffffffffffff50,
             &stack0xffffffffffffff4c);
  local_b8 = ADD;
  local_bc = RBP;
  local_c0 = NUMBER;
  fill.field_2._12_4_ = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (local_10,&stack0xffffffffffffff48,&stack0xffffffffffffff44,&stack0xffffffffffffff40,
             (int *)(fill.field_2._M_local_buf + 0xc));
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_((string *)((long)&done.field_2 + 8),psVar1,lab);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_((string *)local_108,psVar1,lab_00);
  local_118[0] = MOV;
  local_120[1] = 0x14;
  local_120[0] = MEM_R10;
  local_12c[2] = 0xc0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (local_10,local_118,local_120 + 1,local_120,(int *)(local_12c + 2));
  local_12c[1] = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (local_10,local_12c + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&done.field_2 + 8));
  local_12c[0] = MOV;
  local_134[1] = 9;
  local_134[0] = MEM_R11;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (local_10,local_12c,local_134 + 1,local_134);
  local_138 = MOV;
  local_140[1] = 0x20;
  local_140[0] = RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (local_10,&local_138,local_140 + 1,local_140);
  local_144 = ADD;
  local_14c[1] = 0x14;
  local_14c[0] = NUMBER;
  local_154[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (local_10,&local_144,local_14c + 1,local_14c,(int *)(local_154 + 1));
  local_154[0] = ADD;
  local_15c[1] = 0x10;
  local_15c[0] = NUMBER;
  local_164[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (local_10,local_154,local_15c + 1,local_15c,(int *)(local_164 + 1));
  local_164[0] = DEC;
  local_168 = RCX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (local_10,local_164,&local_168);
  local_16c = TEST;
  local_174[1] = 0xb;
  local_174[0] = RCX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (local_10,&local_16c,local_174 + 1,local_174);
  local_184[3] = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (local_10,local_184 + 3,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108);
  local_184[2] = 0x35;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (local_10,local_184 + 2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&done.field_2 + 8));
  local_184[1] = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (local_10,local_184 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108);
  local_184[0] = POP;
  local_188 = RCX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (local_10,local_184,&local_188);
  local_18c = MOV;
  local_194[1] = 9;
  local_194[0] = R15;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (local_10,&local_18c,local_194 + 1,local_194);
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::~string((string *)(done.field_2._M_local_buf + 8));
  return;
}

Assistant:

void allocate_buffer_as_string(asmcode& code)
  {
  // assumptions:
  // input: buffer is in BUFFER
  //        size of string is in rax
  // output: result is in rax
  // clobbers r11 and r15
  // does not check the heap
  code.add(asmcode::PUSH, asmcode::RCX);
  code.add(asmcode::MOV, asmcode::R11, BUFFER);
  code.add(asmcode::ADD, asmcode::R11, asmcode::RAX);
  code.add(asmcode::MOV, asmcode::MEM_R11, asmcode::NUMBER, 0); // make closing zeros at end of string in buffer
  code.add(asmcode::SHR, asmcode::RAX, asmcode::NUMBER, 3);
  code.add(asmcode::INC, asmcode::RAX);
  code.add(asmcode::MOV, asmcode::RCX, asmcode::RAX);
  code.add(asmcode::MOV, asmcode::R15, asmcode::NUMBER, (uint64_t)string_tag << (uint64_t)block_shift);
  code.add(asmcode::OR, asmcode::RAX, asmcode::R15);
  code.add(asmcode::MOV, MEM_ALLOC, asmcode::RAX);
  code.add(asmcode::MOV, asmcode::R15, ALLOC);
  code.add(asmcode::OR, asmcode::R15, asmcode::NUMBER, block_tag);
  code.add(asmcode::ADD, ALLOC, asmcode::NUMBER, CELLS(1));

  std::string fill = label_to_string(label++);
  std::string done = label_to_string(label++);

  code.add(asmcode::MOV, asmcode::R11, BUFFER);
  

  code.add(asmcode::LABEL, fill);
  code.add(asmcode::MOV, asmcode::RAX, asmcode::MEM_R11);
  code.add(asmcode::MOV, MEM_ALLOC, asmcode::RAX);
  code.add(asmcode::ADD, asmcode::R11, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::ADD, ALLOC, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::DEC, asmcode::RCX);
  code.add(asmcode::TEST, asmcode::RCX, asmcode::RCX);
  code.add(asmcode::JES, done);
  code.add(asmcode::JMPS, fill);
  code.add(asmcode::LABEL, done);

  code.add(asmcode::POP, asmcode::RCX);

  code.add(asmcode::MOV, asmcode::RAX, asmcode::R15);
  }